

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::chooseColumnSlice(HEkkDual *this,HVector *row_ep)

{
  HEkkDualRow *this_00;
  __atomic_base<int> _Var1;
  int iVar2;
  HighsSplitDeque *pHVar3;
  element_type *peVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  long lVar10;
  HighsInt HVar11;
  HighsTask *pHVar12;
  uint start;
  HighsSimplexAnalysis *this_01;
  long lVar13;
  double dVar14;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar15;
  bool use_row_price_w_switch;
  bool use_col_price;
  bool local_72;
  bool local_71;
  HVector *local_70;
  long *local_68;
  TaskGroup local_60;
  anon_class_32_4_b1b9b1f6 local_50;
  
  if (this->rebuild_reason != 0) {
    return;
  }
  local_70 = row_ep;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2e,0);
  this_00 = &this->dualRow;
  HEkkDualRow::clear(this_00);
  (this->dualRow).workDelta = this->delta_primal;
  HEkkDualRow::createFreemove(this_00,row_ep);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2e,0);
  HEkk::choosePriceTechnique
            (this->ekk_instance_,(this->ekk_instance_->info_).price_strategy,
             (double)row_ep->count * this->inv_solver_num_row,&local_71,&local_72);
  this_01 = this->analysis;
  if (this_01->analyse_simplex_summary_data == true) {
    if (local_71 == true) {
      HighsSimplexAnalysis::operationRecordBefore(this_01,5,local_70->count,0.0);
      this_01 = this->analysis;
      this_01->num_col_price = this_01->num_col_price + 1;
    }
    else {
      HighsSimplexAnalysis::operationRecordBefore
                (this_01,5,local_70->count,(this->ekk_instance_->info_).row_ep_density);
      this_01 = this->analysis;
      if (local_72 == true) {
        this_01->num_row_price_with_switch = this_01->num_row_price_with_switch + 1;
      }
      else {
        this_01->num_row_price = this_01->num_row_price + 1;
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStart(this_01,0x2f,0);
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  local_68 = (long *)__tls_get_addr(&PTR_00441ef0);
  pHVar3 = (HighsSplitDeque *)*local_68;
  uVar7 = (pHVar3->ownerData).head;
  uVar8 = (ulong)uVar7;
  if (uVar8 < 0x2000) {
    uVar9 = (uint32_t)(uVar8 + 1);
    (pHVar3->ownerData).head = uVar9;
    (pHVar3->taskArray)._M_elems[uVar8].metadata.stealer.super___atomic_base<unsigned_long>._M_i = 0
    ;
    *(undefined ***)(pHVar3->taskArray)._M_elems[uVar8].taskData = &PTR_operator___004413b8;
    *(HEkkDual **)((pHVar3->taskArray)._M_elems[uVar8].taskData + 8) = this;
    *(HVector ***)((pHVar3->taskArray)._M_elems[uVar8].taskData + 0x10) = &local_70;
    if ((pHVar3->ownerData).allStolenCopy == true) {
      (pHVar3->stealerData).ts.super___atomic_base<unsigned_long>._M_i = uVar8 << 0x20 | uVar8 + 1;
      (pHVar3->stealerData).allStolen._M_base._M_i = false;
      (pHVar3->ownerData).splitCopy = uVar9;
      (pHVar3->ownerData).allStolenCopy = false;
      if (((pHVar3->splitRequest)._M_base._M_i & 1U) != 0) {
        (pHVar3->splitRequest)._M_base._M_i = false;
      }
      peVar4 = (pHVar3->ownerData).workerBunk.
               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      LOCK();
      _Var1._M_i = (peVar4->haveJobs).super___atomic_base<int>._M_i;
      (peVar4->haveJobs).super___atomic_base<int>._M_i =
           (peVar4->haveJobs).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (_Var1._M_i < (pHVar3->ownerData).numWorkers + -1) {
        HighsSplitDeque::WorkerBunk::publishWork
                  ((pHVar3->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,pHVar3);
      }
    }
    else {
      HighsSplitDeque::growShared(pHVar3);
    }
  }
  else {
    if (((pHVar3->ownerData).splitCopy < 0x2000) && ((pHVar3->ownerData).allStolenCopy == false)) {
      HighsSplitDeque::growShared(pHVar3);
      uVar7 = (pHVar3->ownerData).head;
    }
    (pHVar3->ownerData).head = uVar7 + 1;
    HEkkDualRow::chooseMakepack(this_00,local_70,this->solver_num_col);
    HEkkDualRow::choosePossible(this_00);
  }
  uVar7 = this->slice_num;
  local_50.row_ep = &local_70;
  local_50.this = this;
  local_50.use_col_price = &local_71;
  local_50.use_row_price_w_switch = &local_72;
  if ((int)uVar7 < 2) {
    chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(&local_50,0,uVar7);
  }
  else {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    local_60.workerDeque = (HighsSplitDeque *)*local_68;
    local_60.dequeHead = ((local_60.workerDeque)->ownerData).head;
    do {
      pHVar3 = local_60.workerDeque;
      start = uVar7 >> 1;
      uVar6 = ((local_60.workerDeque)->ownerData).head;
      uVar8 = (ulong)uVar6;
      if (uVar8 < 0x2000) {
        uVar9 = (uint32_t)(uVar8 + 1);
        ((local_60.workerDeque)->ownerData).head = uVar9;
        ((local_60.workerDeque)->taskArray)._M_elems[uVar8].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_60.workerDeque)->taskArray)._M_elems[uVar8].taskData =
             &PTR_operator___00441418;
        *(uint *)(((local_60.workerDeque)->taskArray)._M_elems[uVar8].taskData + 8) = start;
        *(uint *)(((local_60.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0xc) = uVar7;
        pHVar12 = ((local_60.workerDeque)->taskArray)._M_elems + uVar8;
        pHVar12->taskData[0x10] = '\x01';
        pHVar12->taskData[0x11] = '\0';
        pHVar12->taskData[0x12] = '\0';
        pHVar12->taskData[0x13] = '\0';
        *(anon_class_32_4_b1b9b1f6 **)
         (((local_60.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x18) = &local_50;
        if (((local_60.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_60.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar8 << 0x20 | uVar8 + 1;
          ((local_60.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_60.workerDeque)->ownerData).splitCopy = uVar9;
          ((local_60.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_60.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_60.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar4 = ((local_60.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar4->haveJobs).super___atomic_base<int>._M_i;
          (peVar4->haveJobs).super___atomic_base<int>._M_i =
               (peVar4->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_60.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_60.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_60.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_60.workerDeque);
        }
      }
      else {
        if ((((local_60.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_60.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_60.workerDeque);
          uVar6 = (pHVar3->ownerData).head;
        }
        (pHVar3->ownerData).head = uVar6 + 1;
        ::highs::parallel::for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>
                  (start,uVar7,&local_50,1);
      }
      bVar5 = 3 < uVar7;
      uVar7 = start;
    } while (bVar5);
    chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(&local_50,0,start);
    ::highs::parallel::TaskGroup::taskWait(&local_60);
    ::highs::parallel::TaskGroup::~TaskGroup(&local_60);
  }
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  pHVar3 = (HighsSplitDeque *)*local_68;
  pVar15 = HighsSplitDeque::pop(pHVar3);
  pHVar12 = pVar15.second;
  if (pVar15.first == kWork) {
    if ((pHVar12->metadata).stealer.super___atomic_base<unsigned_long>._M_i == 0) {
      (*(code *)**(undefined8 **)pHVar12->taskData)(pHVar12);
    }
  }
  else if (pVar15.first == kStolen) {
    HighsTaskExecutor::sync_stolen_task(pHVar3,pHVar12);
  }
  if (this->analysis->analyse_simplex_summary_data == true) {
    if ((long)this->slice_num < 1) {
      HVar11 = 0;
    }
    else {
      lVar10 = 0;
      HVar11 = 0;
      do {
        HVar11 = HVar11 + *(int *)((long)&this->slice_row_ap[0].count + lVar10);
        lVar10 = lVar10 + 0xb0;
      } while ((long)this->slice_num * 0xb0 - lVar10 != 0);
    }
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,5,HVar11);
  }
  if (0 < this->slice_num) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      HEkkDualRow::chooseJoinpack
                (this_00,(HEkkDualRow *)
                         ((long)&((this->slice_dualRow).
                                  super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ekk_instance_ + lVar13)
                );
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x150;
    } while (lVar10 < this->slice_num);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2f,0);
  this->variable_in = -1;
  if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
    this->rebuild_reason = 6;
    return;
  }
  HVar11 = HEkkDualRow::chooseFinal(this_00);
  if (HVar11 != 0) {
    this->rebuild_reason = (HVar11 >> 0x1f) * -3 + 6;
    return;
  }
  if ((this->slice_num == 0) &&
     (uVar7 = HEkkDualRow::debugChooseColumnInfeasibilities(this_00), uVar7 != 0)) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                "chooseFinal would create %d dual infeasibilities\n",(ulong)uVar7);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x38,0);
    this->rebuild_reason = 9;
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3a,0);
  HEkkDualRow::deleteFreemove(this_00);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3a,0);
  this->variable_in = (this->dualRow).workPivot;
  this->alpha_row = (this->dualRow).workAlpha;
  this->theta_dual = (this->dualRow).workTheta;
  if (this->edge_weight_mode != kDevex) {
    return;
  }
  if (this->new_devex_framework != false) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3b,0);
  HEkkDualRow::computeDevexWeight(this_00,-1);
  if (this->slice_num < 1) {
    dVar14 = (this->dualRow).computed_edge_weight;
  }
  else {
    lVar13 = 0;
    lVar10 = 0;
    do {
      HEkkDualRow::computeDevexWeight
                ((HEkkDualRow *)
                 ((long)&((this->slice_dualRow).
                          super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>._M_impl.
                          super__Vector_impl_data._M_start)->ekk_instance_ + lVar13),
                 (HighsInt)lVar10);
      lVar10 = lVar10 + 1;
      iVar2 = this->slice_num;
      lVar13 = lVar13 + 0x150;
    } while (lVar10 < iVar2);
    dVar14 = (this->dualRow).computed_edge_weight;
    this->computed_edge_weight = dVar14;
    if (iVar2 < 1) goto LAB_0034ce77;
    lVar10 = 0;
    do {
      dVar14 = dVar14 + *(double *)
                         ((long)&((this->slice_dualRow).
                                  super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->computed_edge_weight +
                         lVar10);
      lVar10 = lVar10 + 0x150;
    } while ((long)iVar2 * 0x150 - lVar10 != 0);
  }
  this->computed_edge_weight = dVar14;
LAB_0034ce77:
  if (dVar14 <= 1.0) {
    dVar14 = 1.0;
  }
  this->computed_edge_weight = dVar14;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3b,0);
  return;
}

Assistant:

void HEkkDual::chooseColumnSlice(HVector* row_ep) {
  // Choose the index of a column to enter the basis (CHUZC) by
  // exploiting slices of the pivotal row - for SIP and PAMI
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);

  //  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  const double local_density = 1.0 * row_ep->count * inv_solver_num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  HighsSimplexInfo& info = ekk_instance_.info_;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);

  if (analysis->analyse_simplex_summary_data) {
    const HighsInt row_ep_count = row_ep->count;
    if (use_col_price) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count, 0.0);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price++;
    }
  }
  analysis->simplexTimerStart(PriceChuzc1Clock);
  // Row_ep:         PACK + CC1

  highs::parallel::spawn([&]() {
    dualRow.chooseMakepack(row_ep, solver_num_col);
    dualRow.choosePossible();
  });

  // Row_ap: PRICE + PACK + CC1
  highs::parallel::for_each(0, slice_num, [&](HighsInt start, HighsInt end) {
    const bool quad_precision = false;
    for (HighsInt i = start; i < end; i++) {
      slice_row_ap[i].clear();

      if (use_col_price) {
        // Perform column-wise PRICE
        slice_a_matrix[i].priceByColumn(quad_precision, slice_row_ap[i],
                                        *row_ep);
      } else if (use_row_price_w_switch) {
        // Perform hyper-sparse row-wise PRICE, but switch if the density of
        // row_ap becomes extreme
        slice_ar_matrix[i].priceByRowWithSwitch(
            quad_precision, slice_row_ap[i], *row_ep,
            ekk_instance_.info_.row_ap_density, 0, kHyperPriceDensity);
      } else {
        // Perform hyper-sparse row-wise PRICE
        slice_ar_matrix[i].priceByRow(quad_precision, slice_row_ap[i], *row_ep);
      }

      slice_dualRow[i].clear();
      slice_dualRow[i].workDelta = delta_primal;
      slice_dualRow[i].chooseMakepack(&slice_row_ap[i], slice_start[i]);
      slice_dualRow[i].choosePossible();
    }
  });

  highs::parallel::sync();

  if (analysis->analyse_simplex_summary_data) {
    // Determine the nonzero count of the whole row
    HighsInt row_ap_count = 0;
    for (HighsInt i = 0; i < slice_num; i++)
      row_ap_count += slice_row_ap[i].count;
    analysis->operationRecordAfter(kSimplexNlaPriceAp, row_ap_count);
  }

  // Join CC1 results here
  for (HighsInt i = 0; i < slice_num; i++) {
    dualRow.chooseJoinpack(&slice_dualRow[i]);
  }

  analysis->simplexTimerStop(PriceChuzc1Clock);

  // Infeasible we created before
  variable_in = -1;
  if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
    rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    return;
  }

  // Choose column 2, This only happens if didn't go out
  HighsInt return_code = dualRow.chooseFinal();
  if (return_code) {
    // Only returns -1, if not zero
    assert(return_code == -1);
    if (return_code < 0) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
    } else {
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    }
    return;
  }

  if (slice_num == 0) {
    // This check is only done for serial code - since packIndex/Value
    // is distributed
    HighsInt num_infeasibility = dualRow.debugChooseColumnInfeasibilities();
    if (num_infeasibility) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "chooseFinal would create %d dual infeasibilities\n",
                  (int)num_infeasibility);
      analysis->simplexTimerStop(Chuzc4dClock);
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  variable_in = dualRow.workPivot;
  alpha_row = dualRow.workAlpha;
  theta_dual = dualRow.workTheta;

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the partial sums of the exact Devex weight
    // First the partial sum for row_ep
    dualRow.computeDevexWeight();
    // Second the partial sums for the slices of row_ap
    for (HighsInt i = 0; i < slice_num; i++)
      slice_dualRow[i].computeDevexWeight(i);
    // Accumulate the partial sums
    // Initialise with the partial sum for row_ep
    computed_edge_weight = dualRow.computed_edge_weight;
    // Update with the partial sum for row_ep
    for (HighsInt i = 0; i < slice_num; i++)
      computed_edge_weight += slice_dualRow[i].computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
}